

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O1

void __thiscall
vox::VoxWriter::m_MergeVoxelInCube
          (VoxWriter *this,VoxelX *vX,VoxelY *vY,VoxelZ *vZ,uint8_t *vColorIndex,VoxCube *vCube)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer *ppuVar1;
  KeyFrame *__k;
  int iVar2;
  int iVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  _Rb_tree_header *p_Var8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  bool bVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  uchar local_4b;
  uchar local_4a;
  uchar local_49;
  ulong *local_48;
  uint8_t *local_40;
  map<unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>_>_>_>
  *local_38;
  
  dVar14 = ((double)CONCAT44(0x45300000,(int)(*vX >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)*vX) - 4503599627370496.0);
  dVar18 = ((double)CONCAT44(0x45300000,(int)(*vY >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)*vY) - 4503599627370496.0);
  dVar16 = ((double)CONCAT44(0x45300000,(int)(*vZ >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)*vZ) - 4503599627370496.0);
  dVar15 = (this->maxVolume).lowerBound.x;
  dVar17 = (this->maxVolume).lowerBound.y;
  if (dVar14 <= dVar15) {
    dVar15 = dVar14;
  }
  (this->maxVolume).lowerBound.x = dVar15;
  if (dVar18 <= dVar17) {
    dVar17 = dVar18;
  }
  (this->maxVolume).lowerBound.y = dVar17;
  dVar15 = (this->maxVolume).lowerBound.z;
  if (dVar16 <= dVar15) {
    dVar15 = dVar16;
  }
  (this->maxVolume).lowerBound.z = dVar15;
  dVar15 = (this->maxVolume).upperBound.x;
  if (dVar15 <= dVar14) {
    dVar15 = dVar14;
  }
  (this->maxVolume).upperBound.x = dVar15;
  dVar15 = (this->maxVolume).upperBound.y;
  if (dVar15 <= dVar18) {
    dVar15 = dVar18;
  }
  (this->maxVolume).upperBound.y = dVar15;
  dVar15 = (this->maxVolume).upperBound.z;
  if (dVar15 <= dVar16) {
    dVar15 = dVar16;
  }
  (this->maxVolume).upperBound.z = dVar15;
  __k = &this->m_KeyFrame;
  p_Var12 = (this->voxelId)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var8 = &(this->voxelId)._M_t._M_impl.super__Rb_tree_header;
  p_Var11 = &p_Var8->_M_header;
  if (p_Var12 != (_Base_ptr)0x0) {
    do {
      bVar13 = p_Var12[1]._M_color < *__k;
      if (!bVar13) {
        p_Var11 = p_Var12;
      }
      p_Var12 = (&p_Var12->_M_left)[bVar13];
    } while (p_Var12 != (_Base_ptr)0x0);
  }
  p_Var12 = &p_Var8->_M_header;
  if (((_Rb_tree_header *)p_Var11 != p_Var8) && (p_Var12 = p_Var11, *__k < p_Var11[1]._M_color)) {
    p_Var12 = &p_Var8->_M_header;
  }
  local_38 = &this->voxelId;
  local_48 = vZ;
  if ((_Rb_tree_header *)p_Var12 != p_Var8) {
    pmVar5 = std::
             map<unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>_>_>_>
             ::at(local_38,__k);
    p_Var12 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var8 = &(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
    p_Var11 = &p_Var8->_M_header;
    if (p_Var12 != (_Base_ptr)0x0) {
      do {
        if (*(ulong *)(p_Var12 + 1) >= *vX) {
          p_Var11 = p_Var12;
        }
        p_Var12 = (&p_Var12->_M_left)[*(ulong *)(p_Var12 + 1) < *vX];
      } while (p_Var12 != (_Base_ptr)0x0);
    }
    p_Var12 = &p_Var8->_M_header;
    if (((_Rb_tree_header *)p_Var11 != p_Var8) && (p_Var12 = p_Var11, *vX < *(ulong *)(p_Var11 + 1))
       ) {
      p_Var12 = &p_Var8->_M_header;
    }
    if ((_Rb_tree_header *)p_Var12 != p_Var8) {
      pmVar6 = std::
               map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>
               ::at(pmVar5,vX);
      p_Var12 = (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var8 = &(pmVar6->_M_t)._M_impl.super__Rb_tree_header;
      p_Var11 = &p_Var8->_M_header;
      if (p_Var12 != (_Base_ptr)0x0) {
        do {
          if (*(ulong *)(p_Var12 + 1) >= *vY) {
            p_Var11 = p_Var12;
          }
          p_Var12 = (&p_Var12->_M_left)[*(ulong *)(p_Var12 + 1) < *vY];
        } while (p_Var12 != (_Base_ptr)0x0);
      }
      p_Var12 = &p_Var8->_M_header;
      if (((_Rb_tree_header *)p_Var11 != p_Var8) &&
         (p_Var12 = p_Var11, *vY < *(ulong *)(p_Var11 + 1))) {
        p_Var12 = &p_Var8->_M_header;
      }
      if ((_Rb_tree_header *)p_Var12 != p_Var8) {
        pmVar7 = std::
                 map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                 ::at(pmVar6,vY);
        p_Var12 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var8 = &(pmVar7->_M_t)._M_impl.super__Rb_tree_header;
        p_Var11 = &p_Var8->_M_header;
        if (p_Var12 != (_Base_ptr)0x0) {
          do {
            if (*(ulong *)(p_Var12 + 1) >= *local_48) {
              p_Var11 = p_Var12;
            }
            p_Var12 = (&p_Var12->_M_left)[*(ulong *)(p_Var12 + 1) < *local_48];
          } while (p_Var12 != (_Base_ptr)0x0);
        }
        p_Var12 = &p_Var8->_M_header;
        if (((_Rb_tree_header *)p_Var11 != p_Var8) &&
           (p_Var12 = p_Var11, *local_48 < *(ulong *)(p_Var11 + 1))) {
          p_Var12 = &p_Var8->_M_header;
        }
        if ((_Rb_tree_header *)p_Var12 != p_Var8) {
          return;
        }
      }
    }
  }
  local_40 = vColorIndex;
  pmVar9 = std::
           map<unsigned_int,_vox::XYZI,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vox::XYZI>_>_>
           ::operator[](&vCube->xyzis,__k);
  this_00 = &pmVar9->voxels;
  local_49 = (uchar)(*vX % this->m_MaxVoxelPerCubeX);
  iVar4._M_current =
       (pmVar9->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (pmVar9->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (this_00,iVar4,&local_49);
  }
  else {
    *iVar4._M_current = local_49;
    ppuVar1 = &(pmVar9->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  local_4a = (uchar)(*vY % this->m_MaxVoxelPerCubeY);
  iVar4._M_current =
       (pmVar9->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (pmVar9->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (this_00,iVar4,&local_4a);
  }
  else {
    *iVar4._M_current = local_4a;
    ppuVar1 = &(pmVar9->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  local_4b = (uchar)(*local_48 % this->m_MaxVoxelPerCubeZ);
  iVar4._M_current =
       (pmVar9->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (pmVar9->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (this_00,iVar4,&local_4b);
  }
  else {
    *iVar4._M_current = local_4b;
    ppuVar1 = &(pmVar9->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  iVar2 = *(int *)&(pmVar9->voxels).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  iVar3 = *(int *)&(pmVar9->voxels).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  pmVar5 = std::
           map<unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>_>_>_>
           ::operator[](local_38,__k);
  pmVar6 = std::
           map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>
           ::operator[](pmVar5,vX);
  pmVar7 = std::
           map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
           ::operator[](pmVar6,vY);
  pmVar10 = std::
            map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::operator[](pmVar7,local_48);
  *pmVar10 = (long)(iVar2 - iVar3);
  iVar4._M_current =
       (pmVar9->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (pmVar9->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,iVar4,local_40);
  }
  else {
    *iVar4._M_current = *local_40;
    ppuVar1 = &(pmVar9->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return;
}

Assistant:

void VoxWriter::m_MergeVoxelInCube(const VoxelX& vX, const VoxelY& vY, const VoxelZ& vZ, const uint8_t& vColorIndex, VoxCube* vCube) {
    maxVolume.Combine(ct::dvec3((double)vX, (double)vY, (double)vZ));

    bool exist = false;
    if (voxelId.find(m_KeyFrame) != voxelId.end()) {
        auto& vidk = voxelId.at(m_KeyFrame);
        if (vidk.find(vX) != vidk.end()) {
            auto& vidkx = vidk.at(vX);
            if (vidkx.find(vY) != vidkx.end()) {
                auto& vidkxy = vidkx.at(vY);
                if (vidkxy.find(vZ) != vidkxy.end()) {
                    exist = true;
                }
            }
        }
    }

    if (!exist) {
        auto& xyzi = vCube->xyzis[m_KeyFrame];
        xyzi.voxels.push_back(Wrap(vX, m_MaxVoxelPerCubeX));                      // x
        xyzi.voxels.push_back(Wrap(vY, m_MaxVoxelPerCubeY));                      // y
        xyzi.voxels.push_back(Wrap(vZ, m_MaxVoxelPerCubeZ));                      // z

        // correspond a la loc de la couleur du voxel en question
        voxelId[m_KeyFrame][vX][vY][vZ] = (int)xyzi.voxels.size();

        xyzi.voxels.push_back(vColorIndex);  // color index
    }
}